

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

Result wabt::ResolveNamesScript(Script *script,Errors *errors)

{
  Result RVar1;
  undefined1 local_d0 [8];
  NameResolver resolver;
  Errors *errors_local;
  Script *script_local;
  
  resolver._168_8_ = errors;
  anon_unknown_14::NameResolver::NameResolver((NameResolver *)local_d0,script,errors);
  RVar1 = anon_unknown_14::NameResolver::VisitScript((NameResolver *)local_d0,script);
  anon_unknown_14::NameResolver::~NameResolver((NameResolver *)local_d0);
  return (Result)RVar1.enum_;
}

Assistant:

Result ResolveNamesScript(Script* script, Errors* errors) {
  NameResolver resolver(script, errors);
  return resolver.VisitScript(script);
}